

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_memory_log_store.cxx
# Opt level: O1

void __thiscall nuraft::inmem_log_store::~inmem_log_store(inmem_log_store *this)

{
  ~inmem_log_store(this);
  operator_delete(this);
  return;
}

Assistant:

inmem_log_store::~inmem_log_store() {
    if (disk_emul_thread_) {
        disk_emul_thread_stop_signal_ = true;
        disk_emul_ea_.invoke();
        if (disk_emul_thread_->joinable()) {
            disk_emul_thread_->join();
        }
    }
}